

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

aiVectorKey * Read<aiVectorKey>(aiVectorKey *__return_storage_ptr__,IOStream *stream)

{
  double dVar1;
  aiVector3D aVar2;
  aiVectorKey *v;
  undefined8 local_30;
  float local_28;
  IOStream *stream_local;
  
  aiVectorKey::aiVectorKey(__return_storage_ptr__);
  dVar1 = Read<double>(stream);
  __return_storage_ptr__->mTime = dVar1;
  aVar2 = Read<aiVector3t<float>>(stream);
  local_30 = aVar2._0_8_;
  local_28 = aVar2.z;
  (__return_storage_ptr__->mValue).x = (float)(undefined4)local_30;
  (__return_storage_ptr__->mValue).y = (float)local_30._4_4_;
  (__return_storage_ptr__->mValue).z = local_28;
  return __return_storage_ptr__;
}

Assistant:

aiVectorKey Read<aiVectorKey>(IOStream * stream) {
    aiVectorKey v;
    v.mTime = Read<double>(stream);
    v.mValue = Read<aiVector3D>(stream);
    return v;
}